

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O2

void QUndoStackPrivate::setPrefixedText
               (QAction *action,QString *prefix,QString *defaultText,QString *text)

{
  long lVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((defaultText->d).size == 0) {
    local_38.d = (prefix->d).d;
    local_38.ptr = (prefix->d).ptr;
    local_38.size = (prefix->d).size;
    lVar1 = local_38.size;
    if (local_38.d != (Data *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      lVar1 = (prefix->d).size;
    }
    if ((lVar1 != 0) && ((text->d).size != 0)) {
      QString::append((QChar)(char16_t)&local_38);
    }
    QString::append((QString *)&local_38);
  }
  else {
    if ((text->d).size == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QAction::setText(action,defaultText);
        return;
      }
      goto LAB_005621c6;
    }
    QString::arg<QString,_true>((QString *)&local_38,prefix,text,0,(QChar)0x20);
  }
  QAction::setText(action,(QString *)&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_005621c6:
  __stack_chk_fail();
}

Assistant:

void QUndoStackPrivate::setPrefixedText(QAction *action, const QString &prefix, const QString &defaultText, const QString &text)
{
    if (defaultText.isEmpty()) {
        QString s = prefix;
        if (!prefix.isEmpty() && !text.isEmpty())
            s.append(u' ');
        s.append(text);
        action->setText(s);
    } else {
        if (text.isEmpty())
            action->setText(defaultText);
        else
            action->setText(prefix.arg(text));
    }
}